

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Table_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTableDecl
          (Result<wasm::Table_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames,TableType type)

{
  int __val;
  Name root;
  Name name_;
  Name name_00;
  uint64_t a;
  bool bVar1;
  pointer pTVar2;
  unsigned_long *puVar3;
  Table *pTVar4;
  type item;
  char *__lhs;
  uint64_t local_178;
  Table *local_140;
  ParseDeclsCtx *local_138;
  size_t sStack_130;
  string_view local_128;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  Name local_d8;
  ParseDeclsCtx *local_c8;
  size_t sStack_c0;
  undefined4 local_b0;
  allocator<char> local_a9;
  string local_a8;
  Err local_88;
  ParseDeclsCtx *local_68;
  size_t sStack_60;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_40;
  __single_object t;
  ImportNames *importNames_local;
  Index pos_local;
  ParseDeclsCtx *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  t._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)
       (__uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true>)importNames;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  std::make_unique<wasm::Table>();
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_40);
  (pTVar2->addressType).id = type.addressType.id;
  a = type.limits.initial;
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_40);
  wasm::Address::operator=(&pTVar2->initial,a);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&type.limits.max);
  if (bVar1) {
    puVar3 = std::optional<unsigned_long>::operator*(&type.limits.max);
    local_178 = *puVar3;
  }
  else {
    local_178 = 0xffffffff;
  }
  pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_40);
  wasm::Address::operator=(&pTVar2->max,local_178);
  bVar1 = IString::is((IString *)&this_local);
  if (bVar1) {
    local_68 = this_local;
    sStack_60 = name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_00.super_IString.str._M_len = (size_t)this_local;
    pTVar4 = Module::getTableOrNull(this->wasm,name_00);
    if (pTVar4 != (Table *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"repeated table name",&local_a9);
      Lexer::err(&local_88,&this->in,(ulong)pos,&local_a8);
      Result<wasm::Table_*>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      goto LAB_0230fb9e;
    }
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_40);
    local_c8 = this_local;
    sStack_c0 = name_local.super_IString.str._M_len;
    name_.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_.super_IString.str._M_len = (size_t)this_local;
    Named::setExplicitName((Named *)pTVar2,name_);
  }
  else {
    __lhs = "";
    if ((__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)
        t._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>)0x0) {
      __lhs = "timport$";
    }
    __val = this->tableCounter;
    this->tableCounter = __val + 1;
    std::__cxx11::to_string(&local_118,__val);
    std::operator+(&local_f8,__lhs,&local_118);
    wasm::Name::Name(&local_d8,&local_f8);
    wasm::Name::operator=((Name *)&this_local,&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_138 = this_local;
    sStack_130 = name_local.super_IString.str._M_len;
    root.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)this_local;
    local_128 = (string_view)Names::getValidTableName(this->wasm,root);
    wasm::Name::operator=((Name *)&this_local,(Name *)&local_128);
    pTVar2 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(&local_40);
    wasm::Name::operator=((Name *)pTVar2,(Name *)&this_local);
  }
  item = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator*(&local_40);
  anon_unknown_5::applyImportNames
            (&item->super_Importable,
             (ImportNames *)
             t._M_t.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl);
  local_140 = Module::addTable(this->wasm,&local_40);
  Result<wasm::Table*>::Result<wasm::Table*>
            ((Result<wasm::Table*> *)__return_storage_ptr__,&local_140);
LAB_0230fb9e:
  local_b0 = 1;
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<Table*> ParseDeclsCtx::addTableDecl(Index pos,
                                           Name name,
                                           ImportNames* importNames,
                                           TableType type) {
  auto t = std::make_unique<Table>();
  t->addressType = type.addressType;
  t->initial = type.limits.initial;
  t->max = type.limits.max ? *type.limits.max : Table::kUnlimitedSize;
  if (name.is()) {
    if (wasm.getTableOrNull(name)) {
      // TODO: if the existing table is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated table name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "timport$" : "") + std::to_string(tableCounter++);
    name = Names::getValidTableName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTable(std::move(t));
}